

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void * parallel_iterator_thread(void *args)

{
  void *pvVar1;
  fdb_doc *pfVar2;
  fdb_status fVar3;
  int iVar4;
  int iVar5;
  fdb_status fVar6;
  ulong uVar7;
  pthread_mutex_t *__mutex;
  fdb_doc *doc;
  fdb_iterator *fit2;
  fdb_kvs_handle *snap_db;
  fdb_seqnum_t snap_seqnum;
  fdb_iterator *fit;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  char key [16];
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_doc *local_b0;
  fdb_iterator *local_a8;
  fdb_kvs_handle *local_a0;
  int local_98;
  undefined4 uStack_94;
  fdb_iterator *local_90;
  fdb_kvs_handle *local_88;
  fdb_file_handle *local_80;
  char local_78 [16];
  pthread_mutex_t *local_68;
  undefined8 *local_60;
  timeval local_58;
  fdb_kvs_config local_48;
  
  gettimeofday(&local_58,(__timezone_ptr_t)0x0);
  fdb_get_default_kvs_config();
  __mutex = (pthread_mutex_t *)((long)args + 0x18);
  iVar5 = 0;
  local_68 = __mutex;
  local_60 = (undefined8 *)args;
  while( true ) {
    if (*(int *)((long)args + 8) <= iVar5) {
      pthread_exit((void *)0x0);
    }
    fVar3 = fdb_open(&local_80,*(char **)((long)args + 0x10),*args);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xe3d);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xe3d,"void *parallel_iterator_thread(void *)");
    }
    fVar3 = fdb_kvs_open_default(local_80,&local_88,&local_48);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xe3f);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xe3f,"void *parallel_iterator_thread(void *)");
    }
    iVar4 = pthread_mutex_lock(__mutex);
    if (iVar4 != 0) break;
    fVar3 = fdb_snapshot_open(local_88,&local_a0,0xffffffffffffffff);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118ecc;
    pthread_mutex_unlock(__mutex);
    fdb_get_kvs_seqnum(local_a0,(fdb_seqnum_t *)&local_98);
    fVar3 = fdb_iterator_init(local_a0,&local_90,(void *)0x0,0,(void *)0x0,0,0);
    fdb_iterator_sequence_init(local_a0,&local_a8,0,0,0);
    if (fVar3 != FDB_RESULT_ITERATOR_FAIL) {
      if (fVar3 == FDB_RESULT_SUCCESS) {
        uVar7 = 0;
        do {
          local_b0 = (fdb_doc *)0x0;
          fVar3 = fdb_iterator_get(local_90,&local_b0);
          if (fVar3 != FDB_RESULT_SUCCESS) break;
          sprintf(local_78,"key%05d",uVar7 & 0xffffffff);
          pfVar2 = local_b0;
          pvVar1 = local_b0->key;
          iVar5 = bcmp(pvVar1,local_78,local_b0->keylen);
          if (iVar5 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_78,pvVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xe57);
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xe57,"void *parallel_iterator_thread(void *)");
          }
          uVar7 = uVar7 + 1;
          if ((uVar7 != pfVar2->seqnum) &&
             (fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                     ), uVar7 != local_b0->seqnum)) {
            __assert_fail("doc->seqnum == (fdb_seqnum_t)i+1",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xe58,"void *parallel_iterator_thread(void *)");
          }
          fdb_doc_free(local_b0);
          local_b0 = (fdb_doc *)0x0;
          fVar3 = fdb_iterator_get(local_a8,&local_b0);
          pfVar2 = local_b0;
          if (fVar3 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xe5e);
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xe5e,"void *parallel_iterator_thread(void *)");
          }
          pvVar1 = local_b0->key;
          iVar5 = bcmp(pvVar1,local_78,local_b0->keylen);
          if (iVar5 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_78,pvVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xe5f);
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xe5f,"void *parallel_iterator_thread(void *)");
          }
          if ((uVar7 != pfVar2->seqnum) &&
             (fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                     ), uVar7 != local_b0->seqnum)) {
            __assert_fail("doc->seqnum == (fdb_seqnum_t)i+1",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xe60,"void *parallel_iterator_thread(void *)");
          }
          fdb_doc_free(local_b0);
          fVar3 = fdb_iterator_next(local_90);
          fVar6 = fdb_iterator_next(local_a8);
          if (fVar3 != fVar6) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                   );
            fVar6 = fdb_iterator_next(local_a8);
            if (fVar3 != fVar6) {
              __assert_fail("status == fdb_iterator_next(fit2)",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0xe65,"void *parallel_iterator_thread(void *)");
            }
          }
          args = local_60;
          __mutex = local_68;
        } while (fVar3 == FDB_RESULT_SUCCESS);
        uVar7 = uVar7 & 0xffffffff;
      }
      else {
        uVar7 = 0;
      }
      if ((CONCAT44(uStack_94,local_98) != uVar7) &&
         (fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                 ), CONCAT44(uStack_94,local_98) != uVar7)) {
        __assert_fail("(fdb_seqnum_t)i == snap_seqnum",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe67,"void *parallel_iterator_thread(void *)");
      }
      iVar5 = local_98;
      fVar3 = fdb_iterator_close(local_90);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe6b);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe6b,"void *parallel_iterator_thread(void *)");
      }
      fVar3 = fdb_iterator_close(local_a8);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe6d);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe6d,"void *parallel_iterator_thread(void *)");
      }
      fVar3 = fdb_kvs_close(local_a0);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe6f);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe6f,"void *parallel_iterator_thread(void *)");
      }
      fVar3 = fdb_kvs_close(local_88);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe71);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe71,"void *parallel_iterator_thread(void *)");
      }
      fVar3 = fdb_close(local_80);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe73);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xe73,"void *parallel_iterator_thread(void *)");
      }
    }
  }
  std::__throw_system_error(iVar4);
LAB_00118ecc:
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0xe44);
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xe44,"void *parallel_iterator_thread(void *)");
}

Assistant:

void *parallel_iterator_thread(void *args)
{
    TEST_INIT();

    struct piterator_ctx *ctx = (struct piterator_ctx *)args;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_handle *snap_db;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_iterator *fit, *fit2;
    fdb_status status;
    fdb_seqnum_t snap_seqnum;
    int num_read = 0;
    fdb_doc *doc;
    char key[16];

    while (num_read < ctx->num_docs) {
        status = fdb_open(&dbfile, ctx->filename, ctx->config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        ctx->lock.lock();
        // Open in-memory snapshot
        status = fdb_snapshot_open(db, &snap_db, FDB_SNAPSHOT_INMEM);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        ctx->lock.unlock();

        fdb_get_kvs_seqnum(snap_db, &snap_seqnum);
        // Iterate the in-memory snapshot
        status = fdb_iterator_init(snap_db, &fit, 0, 0, 0, 0, FDB_ITR_NONE);
        fdb_iterator_sequence_init(snap_db, &fit2, 0, 0, FDB_ITR_NONE);

        if (status == FDB_RESULT_ITERATOR_FAIL) {
            continue;
        }
        int i = 0;
        while (status == FDB_RESULT_SUCCESS) {
            doc = NULL;
            status = fdb_iterator_get(fit, &doc);
            if (status != FDB_RESULT_SUCCESS) {
                break;
            }
            sprintf(key, "key%05d", i);
            TEST_CMP(doc->key, key, doc->keylen);
            TEST_CHK(doc->seqnum == (fdb_seqnum_t)i+1);
            // printf("Got %s seqnum %llu\n", key, doc->seqnum);
            fdb_doc_free(doc);
            doc = NULL;

            status = fdb_iterator_get(fit2, &doc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(doc->key, key, doc->keylen);
            TEST_CHK(doc->seqnum == (fdb_seqnum_t)i+1);
            fdb_doc_free(doc);

            i++;
            status = fdb_iterator_next(fit);
            TEST_CHK(status == fdb_iterator_next(fit2));
        }
        TEST_CHK((fdb_seqnum_t)i == snap_seqnum);
        num_read = snap_seqnum;

        status = fdb_iterator_close(fit);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_iterator_close(fit2);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_close(snap_db);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_close(db);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_close(dbfile);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // shutdown
    thread_exit(0);
    return NULL;
}